

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O0

void __thiscall Graph::randomSolution(Graph *this)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  iterator __first;
  iterator __last;
  reference ppEVar6;
  Vertex *pVVar7;
  Edge *this_00;
  Edge *local_80;
  Edge *e_1;
  Vertex *v_1;
  Vertex *no;
  int id;
  int i;
  int n_to_insert;
  int n_inserted_edges;
  Edge *local_48;
  Edge *e;
  Vertex *local_30;
  Vertex *v;
  vector<Edge_*,_std::allocator<Edge_*>_> vec_edges;
  Graph *this_local;
  
  vec_edges.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)this;
  std::vector<Edge_*,_std::allocator<Edge_*>_>::vector
            ((vector<Edge_*,_std::allocator<Edge_*>_> *)&v);
  for (local_30 = get_verticesList(this); local_30 != (Vertex *)0x0;
      local_30 = Vertex::getNext(local_30)) {
    for (local_48 = Vertex::getEdgesList(local_30); local_48 != (Edge *)0x0;
        local_48 = Edge::getNext(local_48)) {
      Edge::setSwitch(local_48,false);
      std::vector<Edge_*,_std::allocator<Edge_*>_>::push_back
                ((vector<Edge_*,_std::allocator<Edge_*>_> *)&v,&local_48);
    }
  }
  __first = std::vector<Edge_*,_std::allocator<Edge_*>_>::begin
                      ((vector<Edge_*,_std::allocator<Edge_*>_> *)&v);
  __last = std::vector<Edge_*,_std::allocator<Edge_*>_>::end
                     ((vector<Edge_*,_std::allocator<Edge_*>_> *)&v);
  std::random_shuffle<__gnu_cxx::__normal_iterator<Edge**,std::vector<Edge*,std::allocator<Edge*>>>>
            ((__normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>)
             __first._M_current,
             (__normal_iterator<Edge_**,_std::vector<Edge_*,_std::allocator<Edge_*>_>_>)
             __last._M_current);
  i = 0;
  iVar1 = this->verticesSize;
  no._4_4_ = 0;
  while (i < iVar1 + -1) {
    ppEVar6 = std::vector<Edge_*,_std::allocator<Edge_*>_>::at
                        ((vector<Edge_*,_std::allocator<Edge_*>_> *)&v,(long)no._4_4_);
    pVVar7 = Edge::getOrigin(*ppEVar6);
    iVar3 = Vertex::getIdTree(pVVar7);
    ppEVar6 = std::vector<Edge_*,_std::allocator<Edge_*>_>::at
                        ((vector<Edge_*,_std::allocator<Edge_*>_> *)&v,(long)no._4_4_);
    pVVar7 = Edge::getDestiny(*ppEVar6);
    iVar4 = Vertex::getIdTree(pVVar7);
    if (iVar3 != iVar4) {
      ppEVar6 = std::vector<Edge_*,_std::allocator<Edge_*>_>::at
                          ((vector<Edge_*,_std::allocator<Edge_*>_> *)&v,(long)no._4_4_);
      bVar2 = Edge::isClosed(*ppEVar6);
      if (!bVar2) {
        ppEVar6 = std::vector<Edge_*,_std::allocator<Edge_*>_>::at
                            ((vector<Edge_*,_std::allocator<Edge_*>_> *)&v,(long)no._4_4_);
        pVVar7 = Edge::getOrigin(*ppEVar6);
        iVar3 = Vertex::getIdTree(pVVar7);
        for (v_1 = this->verticesList; v_1 != (Vertex *)0x0; v_1 = Vertex::getNext(v_1)) {
          iVar4 = Vertex::getIdTree(v_1);
          if (iVar4 == iVar3) {
            ppEVar6 = std::vector<Edge_*,_std::allocator<Edge_*>_>::at
                                ((vector<Edge_*,_std::allocator<Edge_*>_> *)&v,(long)no._4_4_);
            pVVar7 = Edge::getDestiny(*ppEVar6);
            iVar4 = Vertex::getIdTree(pVVar7);
            Vertex::setIdTree(v_1,iVar4);
          }
        }
        ppEVar6 = std::vector<Edge_*,_std::allocator<Edge_*>_>::at
                            ((vector<Edge_*,_std::allocator<Edge_*>_> *)&v,(long)no._4_4_);
        Edge::setSwitch(*ppEVar6,true);
        ppEVar6 = std::vector<Edge_*,_std::allocator<Edge_*>_>::at
                            ((vector<Edge_*,_std::allocator<Edge_*>_> *)&v,(long)no._4_4_);
        pVVar7 = Edge::getDestiny(*ppEVar6);
        iVar3 = Vertex::getID(pVVar7);
        ppEVar6 = std::vector<Edge_*,_std::allocator<Edge_*>_>::at
                            ((vector<Edge_*,_std::allocator<Edge_*>_> *)&v,(long)no._4_4_);
        pVVar7 = Edge::getOrigin(*ppEVar6);
        iVar4 = Vertex::getID(pVVar7);
        this_00 = findEdge(this,iVar3,iVar4);
        Edge::setSwitch(this_00,true);
        i = i + 1;
      }
    }
    no._4_4_ = no._4_4_ + 1;
  }
  printf("  Aberto:{");
  for (e_1 = (Edge *)this->verticesList; e_1 != (Edge *)0x0;
      e_1 = (Edge *)Vertex::getNext((Vertex *)e_1)) {
    for (local_80 = Vertex::getEdgesList((Vertex *)e_1); local_80 != (Edge *)0x0;
        local_80 = Edge::getNext(local_80)) {
      bVar2 = Edge::isClosed(local_80);
      if (!bVar2) {
        uVar5 = Edge::getID(local_80);
        printf("%d,",(ulong)uVar5);
      }
    }
  }
  printf("  }");
  std::vector<Edge_*,_std::allocator<Edge_*>_>::~vector
            ((vector<Edge_*,_std::allocator<Edge_*>_> *)&v);
  return;
}

Assistant:

void Graph::randomSolution(){
    vector<Edge*> vec_edges;
    for(Vertex *v = this->get_verticesList(); v!=NULL; v = v->getNext()){
        for(Edge *e = v->getEdgesList(); e!=NULL; e = e->getNext()){
            e->setSwitch(false);
            vec_edges.push_back(e);
        }
    }

    random_shuffle(vec_edges.begin(), vec_edges.end());

    int n_inserted_edges = 0, n_to_insert = this->verticesSize-1;
    for(int i=0; n_inserted_edges < n_to_insert; i++){

        if( (vec_edges.at(i)->getOrigin()->getIdTree() != vec_edges.at(i)->getDestiny()->getIdTree()) &&
                vec_edges.at(i)->isClosed()==false){

            int id = vec_edges.at(i)->getOrigin()->getIdTree();
            for(Vertex *no = this->verticesList; no!=NULL; no = no->getNext()){
                if(no->getIdTree()==id)
                    no->setIdTree(vec_edges.at(i)->getDestiny()->getIdTree());
            }
            vec_edges.at(i)->setSwitch(true);
            this->findEdge(vec_edges.at(i)->getDestiny()->getID(), vec_edges.at(i)->getOrigin()->getID())->setSwitch(true);

            n_inserted_edges++;
        }

    }

    printf("  Aberto:{");
    for(Vertex *v = this->verticesList; v!=NULL; v = v->getNext()){
        for(Edge *e = v->getEdgesList(); e!=NULL; e = e->getNext()){
            if(e->isClosed()==false)
                printf("%d,", e->getID());
        }
    }
    printf("  }");
}